

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

HighsStatus
ipxSolutionToHighsSolution
          (HighsOptions *options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,HighsInt ipx_num_col,
          HighsInt ipx_num_row,vector<double,_std::allocator<double>_> *ipx_x,
          vector<double,_std::allocator<double>_> *ipx_slack_vars,
          vector<double,_std::allocator<double>_> *ipx_y,
          vector<double,_std::allocator<double>_> *ipx_zl,
          vector<double,_std::allocator<double>_> *ipx_zu,HighsModelStatus model_status,
          HighsSolution *highs_solution)

{
  double dVar1;
  int iVar2;
  value_type vVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  double *pdVar8;
  vector<double,_std::allocator<double>_> *in_RDX;
  int *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  int in_stack_00000030;
  undefined1 *in_stack_00000038;
  HighsInt iRow;
  HighsInt iCol;
  double primal_residual;
  HighsInt row_4;
  double primal_residual_norm;
  double dual_residual_1;
  HighsInt row_3;
  HighsInt el_1;
  double check_dual_1;
  HighsInt col_2;
  vector<double,_std::allocator<double>_> final_row_activity;
  bool at_upper;
  bool at_lower;
  double new_dual;
  double new_value;
  double residual;
  double dual_infeasibility;
  double primal_truncation;
  double dual_truncation;
  bool is_col;
  HighsInt var;
  double max_abs_primal_value;
  double dual_margin;
  double primal_margin;
  HighsInt check_row;
  HighsInt check_col;
  double dual_2;
  double value_2;
  double upper_1;
  double lower_1;
  HighsInt row_2;
  HighsInt col_1;
  HighsInt num_col_dual_truncations;
  HighsInt num_col_primal_truncations;
  HighsInt num_dual_truncations;
  HighsInt num_primal_truncations;
  double col_dual_truncation_norm;
  double col_primal_truncation_norm;
  double dual_truncation_norm;
  double primal_truncation_norm;
  bool minimal_truncation;
  bool force_dual_feasibility;
  double dual_1;
  double value_1;
  double upper;
  double lower;
  HighsInt row_1;
  double delta_norm;
  HighsInt ipx_row;
  double dual;
  double dual_residual;
  HighsInt row;
  HighsInt el;
  double check_dual;
  double value;
  HighsInt col;
  double dual_residual_norm;
  HighsInt ipx_slack;
  bool get_row_activities;
  vector<double,_std::allocator<double>_> row_activity;
  vector<double,_std::allocator<double>_> *ipx_row_value;
  vector<double,_std::allocator<double>_> *ipx_col_value;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  size_type in_stack_fffffffffffffca8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  value_type vVar9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcd0;
  int local_230;
  int local_22c;
  double local_228;
  int local_21c;
  HighsLogOptions *local_218;
  double local_210;
  value_type local_208;
  int local_204;
  vector<double,_std::allocator<double>_> *local_200;
  int local_1f4;
  undefined8 local_1f0;
  vector<double,_std::allocator<double>_> local_1e8;
  double local_1d0;
  undefined1 local_1c2;
  undefined1 local_1c1;
  double local_1c0;
  value_type local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  byte local_17d;
  int local_17c;
  double local_178 [3];
  undefined4 local_160;
  undefined4 local_15c;
  value_type local_158;
  value_type local_150;
  value_type local_148;
  value_type local_140;
  int local_138;
  int local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  HighsLogOptions *local_120;
  HighsLogOptions *local_118;
  HighsLogOptions *local_110;
  HighsLogOptions *local_108;
  undefined1 local_fa;
  undefined1 local_f9;
  double local_f8;
  value_type local_f0;
  value_type local_e8;
  double local_e0;
  double local_d8;
  int local_cc;
  HighsLogOptions *local_c8;
  int local_bc;
  value_type local_b8;
  double local_b0;
  int local_a8;
  int local_a4;
  value_type local_a0;
  value_type local_98;
  int local_8c;
  HighsLogOptions *local_88;
  int local_80;
  undefined8 local_70;
  undefined1 local_61;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  double local_30;
  vector<double,_std::allocator<double>_> *local_18;
  int *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_30 = *(double *)(local_8 + 0x118);
  local_38 = *(double *)(local_8 + 0x120);
  local_40 = in_stack_00000008;
  local_48 = in_stack_00000010;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x525f37);
  local_61 = 1;
  local_70 = 0;
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(value_type_conflict1 *)0x525f6c);
  local_80 = *local_10;
  local_88 = (HighsLogOptions *)0x0;
  for (local_8c = 0; local_8c < *local_10; local_8c = local_8c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_8c);
    local_98 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_8c);
    local_a0 = *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)local_8c);
    for (local_a4 = *pvVar5; iVar2 = local_a4,
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                            (long)(local_8c + 1)), vVar9 = local_a0, iVar2 < *pvVar5;
        local_a4 = local_a4 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),(long)local_a4);
      vVar9 = local_98;
      local_a8 = *pvVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                          (long)local_a4);
      dVar1 = *pvVar4;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_a8);
      *pvVar6 = vVar9 * dVar1 + *pvVar6;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000018,(long)local_a8);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                          (long)local_a4);
      local_a0 = -dVar1 * *pvVar4 + local_a0;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000020,(long)local_8c);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000028,(long)local_8c);
    local_b0 = ABS(vVar9 - (dVar1 - *pvVar4));
    pdVar7 = std::max<double>(&local_b0,(double *)&local_88);
    local_88 = (HighsLogOptions *)*pdVar7;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000020,(long)local_8c);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000028,(long)local_8c);
    vVar3 = local_98;
    local_b8 = dVar1 - *pvVar4;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 8),
                        (long)local_8c);
    vVar9 = local_b8;
    *pvVar6 = vVar3;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x20),
                        (long)local_8c);
    *pvVar6 = vVar9;
  }
  local_bc = 0;
  local_80 = *local_10;
  local_c8 = (HighsLogOptions *)0x0;
  for (local_cc = 0; local_cc < local_10[1]; local_cc = local_cc + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),(long)local_cc)
    ;
    local_d8 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),(long)local_cc)
    ;
    local_e0 = *pvVar4;
    if ((-INFINITY < local_d8) || (local_e0 < INFINITY)) {
      local_e8 = 0.0;
      local_f0 = 0.0;
      if ((local_d8 <= -INFINITY) || ((INFINITY <= local_e0 || (local_e0 <= local_d8)))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_bc);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_48,(long)local_bc);
        local_e8 = dVar1 - *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000018,(long)local_bc);
        local_f0 = *pvVar4;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_80);
        local_e8 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000020,(long)local_80);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000028,(long)local_80);
        local_f0 = dVar1 - *pvVar4;
        local_80 = local_80 + 1;
      }
      vVar9 = local_e8;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_cc);
      local_f8 = ABS(vVar9 - *pvVar6);
      pdVar7 = std::max<double>(&local_f8,(double *)&local_c8);
      vVar3 = local_e8;
      local_c8 = (HighsLogOptions *)*pdVar7;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x38),
                          (long)local_cc);
      vVar9 = local_f0;
      *pvVar6 = vVar3;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x50),
                          (long)local_cc);
      *pvVar6 = vVar9;
      local_bc = local_bc + 1;
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_cc);
      vVar9 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x38),
                          (long)local_cc);
      *pvVar6 = vVar9;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x50),
                          (long)local_cc);
      *pvVar6 = 0.0;
    }
  }
  highsLogDev(local_88,(HighsLogType)(local_8 + 0x380),(char *)0x1,
              "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n");
  highsLogDev(local_c8,(HighsLogType)(local_8 + 0x380),(char *)0x1,
              "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n");
  local_f9 = 0;
  local_fa = 1;
  if (in_stack_00000030 == 7) {
    local_108 = (HighsLogOptions *)0x0;
    local_110 = (HighsLogOptions *)0x0;
    local_118 = (HighsLogOptions *)0x0;
    local_120 = (HighsLogOptions *)0x0;
    local_124 = 0;
    local_128 = 0;
    local_12c = 0;
    local_130 = 0;
    local_134 = 0;
    local_138 = 0;
    local_15c = 0xffffff81;
    local_160 = 0xffffffdb;
    local_178[2] = 0.0;
    local_178[1] = 0.0;
    local_178[0] = 0.0;
    for (local_17c = 0; local_17c < *local_10 + local_10[1]; local_17c = local_17c + 1) {
      if (local_17c == *local_10) {
        local_118 = local_108;
        local_120 = local_110;
        local_12c = local_124;
        local_130 = local_128;
        local_108 = (HighsLogOptions *)0x0;
        local_110 = (HighsLogOptions *)0x0;
        local_124 = 0;
        local_128 = 0;
      }
      local_17d = local_17c < *local_10;
      if ((bool)local_17d) {
        local_134 = local_17c;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                            (long)local_17c);
        local_140 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                            (long)local_134);
        local_148 = *pvVar4;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 8),
                            (long)local_134);
        local_150 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x20),
                            (long)local_134);
        local_158 = *pvVar6;
        if (local_134 == -0x7f) {
          printf("Column %d\n",0xffffff81);
        }
      }
      else {
        local_138 = local_17c - *local_10;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                            (long)local_138);
        local_140 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                            (long)local_138);
        local_148 = *pvVar4;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x38),
                            (long)local_138);
        local_150 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x50),
                            (long)local_138);
        local_158 = *pvVar6;
        if (local_138 == -0x25) {
          printf("Row %d\n",0xffffffdb);
        }
      }
      if (local_140 < local_148) {
        local_188 = 0.0;
        local_190 = 0.0;
        local_198 = 0.0;
        local_1a8 = local_140 - local_150;
        local_1b0 = local_150 - local_148;
        pdVar7 = std::max<double>(&local_1a8,&local_1b0);
        local_1a0 = ABS(*pdVar7);
        local_1b8 = local_150;
        local_1c0 = local_158;
        local_1c1 = local_150 <= local_140 + local_30;
        local_1c2 = local_148 - local_30 <= local_150;
        if ((!(bool)local_1c1) || (!(bool)local_1c2)) {
          if ((bool)local_1c1) {
            local_198 = -local_158;
          }
          else if ((bool)local_1c2) {
            local_198 = local_158;
          }
          else {
            local_198 = ABS(local_158);
          }
          if (local_38 < local_198) {
            if (local_198 <= local_1a0) {
              local_128 = local_128 + 1;
              if ((bool)local_1c1) {
                local_1c0 = -0.0;
              }
              else if ((bool)local_1c2) {
                local_1c0 = 0.0;
              }
              else if (local_158 <= 0.0) {
                local_1c0 = -0.0;
              }
              else {
                local_1c0 = 0.0;
              }
            }
            else {
              local_124 = local_124 + 1;
              if (local_158 <= 0.0) {
                if (local_148 <= local_150) {
                  local_1b8 = local_148 + 0.0;
                }
                else {
                  local_1b8 = local_148 - 0.0;
                }
              }
              else if (local_140 <= local_150) {
                local_1b8 = local_140 + 0.0;
              }
              else {
                local_1b8 = local_140 - 0.0;
              }
            }
            local_190 = ABS(local_150 - local_1b8);
            local_188 = ABS(local_158 - local_1c0);
            pdVar7 = std::max<double>(&local_190,(double *)&local_108);
            local_108 = (HighsLogOptions *)*pdVar7;
            pdVar7 = &local_188;
            pdVar8 = std::max<double>(pdVar7,(double *)&local_110);
            local_110 = (HighsLogOptions *)*pdVar8;
            std::abs((int)pdVar7);
            pdVar7 = std::max<double>(&local_1d0,local_178);
            vVar9 = local_1b8;
            local_178[0] = *pdVar7;
            if ((local_17d & 1) == 0) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (in_stack_00000038 + 0x38),(long)local_138);
              dVar1 = local_1c0;
              *pvVar6 = vVar9;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (in_stack_00000038 + 0x50),(long)local_138);
              *pvVar6 = dVar1;
            }
            else {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 8)
                                  ,(long)local_134);
              dVar1 = local_1c0;
              *pvVar6 = vVar9;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  (in_stack_00000038 + 0x20),(long)local_134);
              *pvVar6 = dVar1;
            }
          }
        }
      }
    }
    highsLogDev(local_118,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal truncations is %10.4g\n",
                (ulong)local_12c);
    highsLogDev(local_108,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal truncations is %10.4g\n",
                (ulong)local_124);
    highsLogDev(local_120,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual truncations is %10.4g\n",
                (ulong)local_130);
    highsLogDev(local_110,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual truncations is %10.4g\n",
                (ulong)local_128);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x527076);
    local_1f0 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(value_type_conflict1 *)0x5270a0)
    ;
    local_88 = (HighsLogOptions *)0x0;
    for (local_1f4 = 0; local_1f4 < *local_10; local_1f4 = local_1f4 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_1f4)
      ;
      local_200 = (vector<double,_std::allocator<double>_> *)*pvVar4;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)local_1f4);
      for (local_204 = *pvVar5; iVar2 = local_204,
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                              (long)(local_1f4 + 1)), iVar2 < *pvVar5; local_204 = local_204 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),(long)local_204);
        local_208 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 8),
                            (long)local_1f4);
        vVar9 = *pvVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                            (long)local_204);
        dVar1 = *pvVar4;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_1e8,(long)local_208);
        *pvVar6 = vVar9 * dVar1 + *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x50),
                            (long)local_208);
        dVar1 = *pvVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                            (long)local_204);
        local_200 = (vector<double,_std::allocator<double>_> *)
                    (-dVar1 * *pvVar4 + (double)local_200);
      }
      in_stack_fffffffffffffcc0 = local_200;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x20),
                          (long)local_1f4);
      local_210 = ABS((double)in_stack_fffffffffffffcc0 - *pvVar6);
      pdVar7 = std::max<double>(&local_210,(double *)&local_88);
      local_88 = (HighsLogOptions *)*pdVar7;
    }
    local_218 = (HighsLogOptions *)0x0;
    for (local_21c = 0; local_21c < local_10[1]; local_21c = local_21c + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,(long)local_21c);
      vVar9 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x38),
                          (long)local_21c);
      local_228 = ABS(vVar9 - *pvVar6);
      pdVar7 = std::max<double>(&local_228,(double *)&local_218);
      local_218 = (HighsLogOptions *)*pdVar7;
    }
    highsLogDev(local_218,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Final norm of primal residual values is %10.4g\n");
    highsLogDev(local_88,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                "ipxSolutionToHighsSolution: Final norm of dual   residual values is %10.4g\n");
    if (1e+25 < local_178[0]) {
      printf("ipxSolutionToHighsSolution: Excessive corrected |primal value| is %10.4g\n",
             local_178[0]);
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcc0);
  }
  if (local_10[0x3c] == -1) {
    for (local_22c = 0; local_22c < *local_10; local_22c = local_22c + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x20),
                          (long)local_22c);
      *pvVar6 = *pvVar6 * -1.0;
    }
    for (local_230 = 0; local_230 < local_10[1]; local_230 = local_230 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000038 + 0x50),
                          (long)local_230);
      *pvVar6 = *pvVar6 * -1.0;
    }
  }
  *in_stack_00000038 = 1;
  in_stack_00000038[1] = 1;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcc0);
  return kOk;
}

Assistant:

HighsStatus ipxSolutionToHighsSolution(
    const HighsOptions& options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const HighsInt ipx_num_col, const HighsInt ipx_num_row,
    const std::vector<double>& ipx_x, const std::vector<double>& ipx_slack_vars,
    const std::vector<double>& ipx_y, const std::vector<double>& ipx_zl,
    const std::vector<double>& ipx_zu, const HighsModelStatus model_status,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);

  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  const std::vector<double>& ipx_col_value = ipx_x;
  const std::vector<double>& ipx_row_value = ipx_slack_vars;

  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  const bool get_row_activities = true;  // ipx_num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt ipx_slack = lp.num_col_;
  assert(ipx_num_row == lp.num_row_);
  double dual_residual_norm = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = ipx_col_value[col];
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] += value * lp.a_matrix_.value_[el];
        check_dual -= ipx_y[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - (ipx_zl[col] - ipx_zu[col]));
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double dual = ipx_zl[col] - ipx_zu[col];
    highs_solution.col_value[col] = value;
    highs_solution.col_dual[col] = dual;
  }
  HighsInt ipx_row = 0;
  ipx_slack = lp.num_col_;
  double delta_norm = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so set it to its row activity
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
      continue;
    }
    // Non-free row, so IPX will have it
    double value = 0;
    double dual = 0;
    if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
      assert(constraint_type[ipx_row] == '=');
      // Boxed row - look at its slack
      value = ipx_col_value[ipx_slack];
      dual = ipx_zl[ipx_slack] - ipx_zu[ipx_slack];
      // Update the slack to be used for boxed rows
      ipx_slack++;
    } else {
      value = rhs[ipx_row] - ipx_row_value[ipx_row];
      dual = ipx_y[ipx_row];
    }
    delta_norm = std::max(std::fabs(value - row_activity[row]), delta_norm);
    highs_solution.row_value[row] = value;
    highs_solution.row_dual[row] = dual;
    // Update the IPX row index
    ipx_row++;
  }
  //  if (delta_norm >= dual_feasibility_tolerance)
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n",
      dual_residual_norm);
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n",
      delta_norm);
  const bool force_dual_feasibility = false;  // true;
  const bool minimal_truncation = true;
  if (model_status == HighsModelStatus::kOptimal &&
      (force_dual_feasibility || minimal_truncation)) {
    double primal_truncation_norm = 0;
    double dual_truncation_norm = 0;
    double col_primal_truncation_norm = 0;
    double col_dual_truncation_norm = 0;
    HighsInt num_primal_truncations = 0;
    HighsInt num_dual_truncations = 0;
    HighsInt num_col_primal_truncations = 0;
    HighsInt num_col_dual_truncations = 0;
    HighsInt col = 0, row = 0;
    double lower, upper, value, dual;
    const HighsInt check_col = -127;
    const HighsInt check_row = -37;
    // Truncating to tolerances can lead to infeasibilities by margin
    // of machine precision
    const double primal_margin = 0;  // primal_feasibility_tolerance;
    const double dual_margin = 0;    // dual_feasibility_tolerance;
    double max_abs_primal_value = 0;
    for (HighsInt var = 0; var < lp.num_col_ + lp.num_row_; var++) {
      if (var == lp.num_col_) {
        col_primal_truncation_norm = primal_truncation_norm;
        col_dual_truncation_norm = dual_truncation_norm;
        num_col_primal_truncations = num_primal_truncations;
        num_col_dual_truncations = num_dual_truncations;
        primal_truncation_norm = 0;
        dual_truncation_norm = 0;
        num_primal_truncations = 0;
        num_dual_truncations = 0;
      }
      const bool is_col = var < lp.num_col_;
      if (is_col) {
        col = var;
        lower = lp.col_lower_[col];
        upper = lp.col_upper_[col];
        value = highs_solution.col_value[col];
        dual = highs_solution.col_dual[col];
        if (col == check_col) {
          printf("Column %d\n", (int)check_col);
        }
      } else {
        row = var - lp.num_col_;
        lower = lp.row_lower_[row];
        upper = lp.row_upper_[row];
        value = highs_solution.row_value[row];
        dual = highs_solution.row_dual[row];
        if (row == check_row) {
          printf("Row %d\n", (int)check_row);
        }
      }
      // Continue if equality: cannot have dual infeasibility
      if (lower >= upper) continue;
      double dual_truncation = 0;
      double primal_truncation = 0;
      double dual_infeasibility = 0;
      double residual = std::fabs(std::max(lower - value, value - upper));
      double new_value = value;
      double new_dual = dual;
      const bool at_lower = value <= lower + primal_feasibility_tolerance;
      const bool at_upper = value >= upper - primal_feasibility_tolerance;
      // Continue if at distinct bounds: cannot have dual infeasibility
      if (at_lower && at_upper) continue;
      if (at_lower) {
        dual_infeasibility = -dual;
      } else if (at_upper) {
        dual_infeasibility = dual;
      } else {
        dual_infeasibility = std::fabs(dual);
      }
      // Continue if no dual infeasibility
      if (dual_infeasibility <= dual_feasibility_tolerance) continue;

      if (residual < dual_infeasibility && !force_dual_feasibility) {
        /*
          // Residual is less than dual infeasibility, or not forcing
          // dual feasibility, so truncate value
          if (at_lower) {
            assert(10 == 50);
          } else if (at_upper) {
            assert(11 == 50);
          } else {
            // Off bound
            if (lower <= -kHighsInf) {
              if (upper >= kHighsInf) {
                // Free shouldn't be possible, as residual would be inf
                assert(12 == 50);
              } else {
                // Upper bounded, so assume dual is negative
                if (dual > 0) assert(13 == 50);
              }
            } else if (upper >= kHighsInf) {
              // Lower bounded, so assume dual is positive
              if (dual < 0) assert(14 == 50);
            }
          }
        */
        num_primal_truncations++;
        if (dual > 0) {
          // Put closest to lower
          if (value < lower) {
            new_value = lower - primal_margin;
          } else {
            new_value = lower + primal_margin;
          }
        } else {
          // Put closest to upper
          if (value < upper) {
            new_value = upper - primal_margin;
          } else {
            new_value = upper + primal_margin;
          }
        }
      } else {
        // Residual is greater than dual infeasibility, or forcing
        // dual feasibility, so truncate dual
        num_dual_truncations++;
        if (at_lower) {
          // At lower bound, so possibly truncate to -dual_margin
          new_dual = -dual_margin;
        } else if (at_upper) {
          // At upper bound, so possibly truncate to dual_margin
          new_dual = dual_margin;
        } else {
          // Between bounds so possibly set dual to signed dual_margin
          if (dual > 0) {
            new_dual = dual_margin;
          } else {
            new_dual = -dual_margin;
          }
        }
      }
      primal_truncation = std::fabs(value - new_value);
      dual_truncation = std::fabs(dual - new_dual);
      primal_truncation_norm =
          std::max(primal_truncation, primal_truncation_norm);
      dual_truncation_norm = std::max(dual_truncation, dual_truncation_norm);
      /*if (dual_truncation > 1e-2 || primal_truncation > 1e-2)
        printf(
            "%s %4d: [%11.4g, %11.4g, %11.4g] residual = %11.4g; new = %11.4g; "
            "truncation = %11.4g | "
            "dual = %11.4g; new = %11.4g; truncation = %11.4g\n",
            is_col ? "Col" : "Row", (int)(is_col ? col : row), lower, value,
            upper, residual, new_value, primal_truncation, dual, new_dual,
            dual_truncation);
      */
      max_abs_primal_value =
          std::max(std::abs(new_value), max_abs_primal_value);
      if (is_col) {
        highs_solution.col_value[col] = new_value;
        highs_solution.col_dual[col] = new_dual;
      } else {
        highs_solution.row_value[row] = new_value;
        highs_solution.row_dual[row] = new_dual;
      }
    }
    // Assess the truncations
    //  if (dual_truncation_norm >= dual_margin)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal "
                "truncations is %10.4g\n",
                num_col_primal_truncations, col_primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal "
                "truncations is %10.4g\n",
                num_primal_truncations, primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual "
                "truncations is %10.4g\n",
                num_col_dual_truncations, col_dual_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual "
                "truncations is %10.4g\n",
                num_dual_truncations, dual_truncation_norm);
    // Determine the new residuals

    vector<double> final_row_activity;
    final_row_activity.assign(lp.num_row_, 0);
    dual_residual_norm = 0;
    for (HighsInt col = 0; col < lp.num_col_; col++) {
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        final_row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
        check_dual -= highs_solution.row_dual[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - highs_solution.col_dual[col]);
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double primal_residual_norm = 0;
    for (HighsInt row = 0; row < lp.num_row_; row++) {
      double primal_residual =
          std::fabs(final_row_activity[row] - highs_solution.row_value[row]);
      primal_residual_norm = std::max(primal_residual, primal_residual_norm);
    }
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of primal residual "
                "values is %10.4g\n",
                primal_residual_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of dual   residual "
                "values is %10.4g\n",
                dual_residual_norm);
    if (max_abs_primal_value > kExcessivePrimalValue) {
      //    highsLogUser(options.log_options, HighsLogType::kInfo,
      printf(
          "ipxSolutionToHighsSolution: "
          "Excessive corrected |primal value| is %10.4g\n",
          max_abs_primal_value);
    }
  }
  assert(ipx_row == ipx_num_row);
  assert(ipx_slack == ipx_num_col);
  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  // Indicate that the primal and dual solution are known
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  return HighsStatus::kOk;
}